

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O0

int If_DsdManCompute(If_DsdMan_t *p,word *pTruth,int nLeaves,uchar *pPerm,char *pLutStruct)

{
  FILE *pFile;
  int iVar1;
  word *pIn1;
  int local_a24;
  int nWords;
  int nSupp;
  int nSizeNonDec;
  int iDsd;
  char pDsd [2000];
  word *pRes;
  word pCopy [64];
  char *pLutStruct_local;
  uchar *pPerm_local;
  int nLeaves_local;
  word *pTruth_local;
  If_DsdMan_t *p_local;
  
  local_a24 = 0;
  iVar1 = Abc_TtWordNum(nLeaves);
  if (0xc < nLeaves) {
    __assert_fail("nLeaves <= DAU_MAX_VAR",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                  ,0x816,"int If_DsdManCompute(If_DsdMan_t *, word *, int, unsigned char *, char *)"
                 );
  }
  Abc_TtCopy((word *)&pRes,pTruth,iVar1,0);
  nWords = Dau_DsdDecompose((word *)&pRes,nLeaves,0,1,(char *)&nSizeNonDec);
  if (0 < nWords) {
    Abc_TtStretch6((word *)&pRes,nWords,p->nVars);
  }
  memset(pPerm,0xff,(long)nLeaves);
  nSupp = If_DsdManAddDsd(p,(char *)&nSizeNonDec,(word *)&pRes,pPerm,&local_a24);
  if (local_a24 == nLeaves) {
    pIn1 = If_DsdManComputeTruth(p,nSupp,pPerm);
    iVar1 = Abc_TtEqual(pIn1,pTruth,iVar1);
    if (iVar1 == 0) {
      printf("\n");
      printf("Verification failed!\n");
      printf("%s\n",&nSizeNonDec);
      Dau_DsdPrintFromTruth(pTruth,nLeaves);
      Dau_DsdPrintFromTruth(pIn1,nLeaves);
      pFile = _stdout;
      iVar1 = Abc_Lit2Var(nSupp);
      If_DsdManPrintOne(pFile,p,iVar1,pPerm,1);
      printf("\n");
    }
    iVar1 = Abc_Lit2Var(nSupp);
    If_DsdVecObjIncRef(&p->vObjs,iVar1);
    iVar1 = If_DsdVecLitSuppSize(&p->vObjs,nSupp);
    if (iVar1 == nLeaves) {
      return nSupp;
    }
    __assert_fail("If_DsdVecLitSuppSize(&p->vObjs, iDsd) == nLeaves",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                  ,0x832,"int If_DsdManCompute(If_DsdMan_t *, word *, int, unsigned char *, char *)"
                 );
  }
  __assert_fail("nSupp == nLeaves",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                ,0x821,"int If_DsdManCompute(If_DsdMan_t *, word *, int, unsigned char *, char *)");
}

Assistant:

int If_DsdManCompute( If_DsdMan_t * p, word * pTruth, int nLeaves, unsigned char * pPerm, char * pLutStruct )
{
    word pCopy[DAU_MAX_WORD], * pRes;
    char pDsd[DAU_MAX_STR];
    int iDsd, nSizeNonDec, nSupp = 0;
    int nWords = Abc_TtWordNum(nLeaves);
//    abctime clk = 0;
    assert( nLeaves <= DAU_MAX_VAR );
    Abc_TtCopy( pCopy, pTruth, nWords, 0 );
//clk = Abc_Clock();
    nSizeNonDec = Dau_DsdDecompose( pCopy, nLeaves, 0, 1, pDsd );
//p->timeDsd += Abc_Clock() - clk;
    if ( nSizeNonDec > 0 )
        Abc_TtStretch6( pCopy, nSizeNonDec, p->nVars );
    memset( pPerm, 0xFF, (size_t)nLeaves );
//clk = Abc_Clock();
    iDsd = If_DsdManAddDsd( p, pDsd, pCopy, pPerm, &nSupp );
//p->timeCanon += Abc_Clock() - clk;
    assert( nSupp == nLeaves );
    // verify the result
//clk = Abc_Clock();
    pRes = If_DsdManComputeTruth( p, iDsd, pPerm );
//p->timeVerify += Abc_Clock() - clk;
    if ( !Abc_TtEqual(pRes, pTruth, nWords) )
    {
//        If_DsdManPrint( p, NULL );
        printf( "\n" );
        printf( "Verification failed!\n" );
        printf( "%s\n", pDsd );
        Dau_DsdPrintFromTruth( pTruth, nLeaves );
        Dau_DsdPrintFromTruth( pRes, nLeaves );
        If_DsdManPrintOne( stdout, p, Abc_Lit2Var(iDsd), pPerm, 1 );
        printf( "\n" );
    }
    If_DsdVecObjIncRef( &p->vObjs, Abc_Lit2Var(iDsd) );
    assert( If_DsdVecLitSuppSize(&p->vObjs, iDsd) == nLeaves );
    return iDsd;
}